

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void write_local_cert(scep *s)

{
  stack_st_X509 *sk;
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  X509 *a;
  X509_NAME *pXVar5;
  char *pcVar6;
  char *pcVar7;
  X509_NAME *b;
  FILE *fp_00;
  char local_438 [8];
  char buffer [1024];
  int i;
  FILE *fp;
  X509 *cert;
  stack_st_X509 *certs;
  PKCS7 *p7;
  scep *s_local;
  
  localcert = (X509 *)0x0;
  sk = ((s->reply_p7->d).sign)->cert;
  if (v_flag != 0) {
    pOVar4 = ossl_check_const_X509_sk_type(sk);
    uVar2 = OPENSSL_sk_num(pOVar4);
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
  }
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  while( true ) {
    uVar1 = buffer._1020_4_;
    pOVar4 = ossl_check_const_X509_sk_type(sk);
    iVar3 = OPENSSL_sk_num(pOVar4);
    a = (X509 *)localcert;
    if (iVar3 <= (int)uVar1) break;
    pOVar4 = ossl_check_const_X509_sk_type(sk);
    a = (X509 *)OPENSSL_sk_value(pOVar4,buffer._1020_4_);
    pcVar7 = pname;
    if (v_flag != 0) {
      pXVar5 = X509_get_subject_name(a);
      pcVar6 = X509_NAME_oneline(pXVar5,local_438,0x400);
      printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar7,pcVar6);
      pXVar5 = X509_get_issuer_name(a);
      pcVar7 = X509_NAME_oneline(pXVar5,local_438,0x400);
      printf("  issuer: %s\n",pcVar7);
      pXVar5 = (X509_NAME *)X509_REQ_get_subject_name(request);
      pcVar7 = X509_NAME_oneline(pXVar5,local_438,0x400);
      printf("  request_subject: \'%s\'\n",pcVar7);
    }
    iVar3 = compare_subject((X509 *)a);
    if (iVar3 == 0) {
      if (v_flag != 0) {
        printf("CN\'s of request and certificate matched!\n");
      }
    }
    else {
      fprintf(_stderr,
              "%s: Subject of our request does not match that of the returned Certificate!\n",pname)
      ;
    }
    pXVar5 = X509_get_subject_name(a);
    b = X509_get_issuer_name(a);
    iVar3 = X509_NAME_cmp(pXVar5,b);
    if (iVar3 != 0) break;
    buffer._1020_4_ = buffer._1020_4_ + 1;
  }
  localcert = (X509 *)a;
  if (localcert == (X509 *)0x0) {
    fprintf(_stderr,"%s: cannot find requested certificate\n",pname);
    exit(0x5d);
  }
  fp_00 = fopen(l_char,"w");
  if (fp_00 != (FILE *)0x0) {
    if (v_flag != 0) {
      printf("%s: certificate written as %s\n",pname,l_char);
    }
    if (d_flag != 0) {
      PEM_write_X509(_stdout,(X509 *)localcert);
    }
    iVar3 = PEM_write_X509(fp_00,(X509 *)localcert);
    if (iVar3 == 1) {
      fclose(fp_00);
      return;
    }
    fprintf(_stderr,"%s: error while writing certificate file\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x5d);
  }
  fprintf(_stderr,"%s: cannot open cert file for writing\n",pname);
  exit(0x5d);
}

Assistant:

void
write_local_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;

	localcert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
       
        if (v_flag) {
		printf ("write_local_cert(): found %d cert(s)\n", sk_X509_num(certs));
        }

	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];
		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: '%s'\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
			printf("  request_subject: '%s'\n", 
				X509_NAME_oneline(X509_REQ_get_subject_name(request),
                                        buffer, sizeof(buffer)));
		}
		/* The subject has to match that of our request */
		if (!compare_subject(cert)) {
			
			if (v_flag)
				printf ("CN's of request and certificate matched!\n");
		} else {
			fprintf(stderr, "%s: Subject of our request does not match that of the returned Certificate!\n", pname);
			//exit (SCEP_PKISTATUS_FILE);
		}
		
		/* The subject cannot be the issuer (selfsigned) */
		if (X509_NAME_cmp(X509_get_subject_name(cert),
			X509_get_issuer_name(cert))) {
				localcert = cert;
				break;
		}
	}
	if (localcert == NULL) {
		fprintf(stderr, "%s: cannot find requested certificate\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, l_char, "w")))
#else
	if (!(fp = fopen(l_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, l_char);
	if (d_flag)
		PEM_write_X509(stdout, localcert);
	if (PEM_write_X509(fp, localcert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}